

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptorProto::SharedCtor(FileDescriptorProto *this,Arena *arena)

{
  Impl_::Impl_((Impl_ *)&this->field_0);
  (this->field_0)._impl_.options_ = (FileOptions *)0x0;
  (this->field_0)._impl_.source_code_info_ = (SourceCodeInfo *)0x0;
  (this->field_0)._impl_.edition_ = 0;
  return;
}

Assistant:

inline void FileDescriptorProto::SharedCtor(::_pb::Arena* PROTOBUF_NULLABLE arena) {
  new (&_impl_) Impl_(internal_visibility(), arena);
  ::memset(reinterpret_cast<char *>(&_impl_) +
               offsetof(Impl_, options_),
           0,
           offsetof(Impl_, edition_) -
               offsetof(Impl_, options_) +
               sizeof(Impl_::edition_));
}